

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
               (long *values,bool *validity,bitpacking_width_t width,long frame_of_reference,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  long *plVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  uint64_t *in;
  ulong uVar10;
  ulong uVar11;
  uint64_t local_138 [33];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar10 = (ulong)width;
  uVar6 = iVar5 * uVar10 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<long,_true,_long> *)data_ptr,uVar6 + 0x10,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  lVar3 = *(long *)((long)data_ptr + 0x48);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  plVar7 = *(long **)((long)data_ptr + 0x40);
  *plVar7 = frame_of_reference;
  *(long **)((long)data_ptr + 0x40) = plVar7 + 1;
  plVar7[1] = uVar10;
  plVar7 = plVar7 + 2;
  *(long **)((long)data_ptr + 0x40) = plVar7;
  uVar8 = count & 0xffffffffffffffe0;
  if (uVar8 != 0) {
    uVar9 = 0;
    uVar11 = 0;
    in = (uint64_t *)values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)plVar7),(uint)width);
      uVar11 = uVar11 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar11 < uVar8);
  }
  if ((count & 0x1f) != 0) {
    uVar9 = (ulong)(((uint)count & 0x1f) << 3);
    switchD_01306cb1::default((void *)((long)local_138 + uVar9),0,0x100 - uVar9);
    switchD_012dd528::default(local_138,values + uVar8,uVar9);
    duckdb_fastpforlib::fastpack
              (local_138,(uint32_t *)((long)plVar7 + (uVar10 * uVar8 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}